

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

size_t __thiscall leveldb::anon_unknown_0::ShardedLRUCache::TotalCharge(ShardedLRUCache *this)

{
  size_t sVar1;
  int s;
  size_t total;
  int local_14;
  LRUCache *this_00;
  
  this_00 = (LRUCache *)0x0;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    sVar1 = LRUCache::TotalCharge(this_00);
    this_00 = (LRUCache *)((this_00->lru_).key_data + (sVar1 - 0x7c));
  }
  return (size_t)this_00;
}

Assistant:

size_t TotalCharge() const override {
    size_t total = 0;
    for (int s = 0; s < kNumShards; s++) {
      total += shard_[s].TotalCharge();
    }
    return total;
  }